

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::Num3(ByteCodeWriter *this,OpCode op,RegSlot C0,RegSlot C1,RegSlot C2)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_24;
  RegSlot RStack_20;
  bool success;
  RegSlot local_1c;
  RegSlot C2_local;
  RegSlot C1_local;
  RegSlot C0_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  RStack_20 = C2;
  local_1c = C1;
  C2_local = C0;
  C1_local._2_2_ = op;
  _C0_local = this;
  CheckOpen(this);
  op_00 = C1_local._2_2_;
  OpLayoutType::OpLayoutType(&local_24,Reg3);
  CheckOp(this,op_00,local_24);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(C1_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x99f,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,C1_local._2_2_,C2_local,local_1c,RStack_20);
  if (((!bVar2) &&
      (bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,C1_local._2_2_,C2_local,local_1c,RStack_20), !bVar2)) &&
     (bVar2 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,C1_local._2_2_,C2_local,local_1c,RStack_20), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x9a1,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::Num3(OpCode op, RegSlot C0, RegSlot C1, RegSlot C2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        MULTISIZE_LAYOUT_WRITE(Reg3, op, C0, C1, C2);
    }